

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zes_nullddi.cpp
# Opt level: O2

ze_result_t
driver::zesTemperatureSetConfig(zes_temp_handle_t hTemperature,zes_temp_config_t *pConfig)

{
  ze_result_t zVar1;
  
  if (DAT_0010dd28 != (code *)0x0) {
    zVar1 = (*DAT_0010dd28)();
    return zVar1;
  }
  return ZE_RESULT_SUCCESS;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zesTemperatureSetConfig(
        zes_temp_handle_t hTemperature,                 ///< [in] Handle for the component.
        const zes_temp_config_t* pConfig                ///< [in] New configuration.
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // if the driver has created a custom function, then call it instead of using the generic path
        auto pfnSetConfig = context.zesDdiTable.Temperature.pfnSetConfig;
        if( nullptr != pfnSetConfig )
        {
            result = pfnSetConfig( hTemperature, pConfig );
        }
        else
        {
            // generic implementation
        }

        return result;
    }